

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::HasSymUse(Instr *this,StackSym *sym)

{
  bool bVar1;
  
  bVar1 = HasSymUseSrc(sym,this->m_src1);
  if (!bVar1) {
    bVar1 = HasSymUseSrc(sym,this->m_src2);
    if (!bVar1) {
      bVar1 = HasSymUseDst(sym,this->m_dst);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool
Instr::HasSymUse(StackSym *sym)
{
    if (HasSymUseSrc(sym, this->GetSrc1()))
    {
        return true;
    }
    if (HasSymUseSrc(sym, this->GetSrc2()))
    {
        return true;
    }
    if (HasSymUseDst(sym, this->GetDst()))
    {
        return true;
    }
    return false;
}